

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
          (BumpAllocator *this,Type *args,
          span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *args_1,
          SourceLocation *args_2,Expression *args_3,Expression *args_4,SourceRange *args_5,
          bool *args_6,bool *args_7)

{
  size_t sVar1;
  SourceRange sourceRange;
  SourceLocation opLoc;
  ConditionalExpression *in_RSI;
  SourceLocation in_R8;
  SourceLocation in_R9;
  span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_00000008;
  byte *in_stack_00000010;
  byte *in_stack_00000018;
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Expression *in_stack_ffffffffffffffc0;
  
  opLoc = (SourceLocation)
          allocate((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (size_t)in_stack_ffffffffffffff78);
  std::span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>::
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
            ((span<const_slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  sVar1 = (in_stack_00000008->_M_extent)._M_extent_value;
  sourceRange.endLoc = in_R8;
  sourceRange.startLoc = in_R9;
  slang::ast::ConditionalExpression::ConditionalExpression
            (in_RSI,(Type *)CONCAT44(in_stack_ffffffffffffff8c,(uint)(*in_stack_00000018 & 1)),
             *in_stack_00000008,opLoc,
             (Expression *)CONCAT44(in_stack_ffffffffffffff84,(uint)(*in_stack_00000010 & 1)),
             in_stack_ffffffffffffffc0,sourceRange,SUB81(sVar1 >> 0x38,0),SUB81(sVar1 >> 0x30,0));
  return (ConditionalExpression *)opLoc;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }